

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  char *git_rev_list [7];
  OutputLogger err;
  OneLineParser out;
  
  git_rev_list[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  git_rev_list[1] = "rev-list";
  git_rev_list[2] = "-n";
  git_rev_list[3] = "1";
  git_rev_list[4] = "HEAD";
  git_rev_list[5] = "--";
  git_rev_list[6] = (char *)0x0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&out,this,"rl-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rl-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,git_rev_list,(OutputParser *)&out,(OutputParser *)&err,
                      (char *)0x0,Auto);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::GetWorkingRevision()
{
  // Run plumbing "git rev-list" to get work tree revision.
  const char* git = this->CommandLineTool.c_str();
  const char* git_rev_list[] = { git,    "rev-list", "-n",   "1",
                                 "HEAD", "--",       nullptr };
  std::string rev;
  OneLineParser out(this, "rl-out> ", rev);
  OutputLogger err(this->Log, "rl-err> ");
  this->RunChild(git_rev_list, &out, &err);
  return rev;
}